

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyFromBuffer::prepare
          (BufferCopyFromBuffer *this,PrepareContext *context)

{
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  RefData<vk::Handle<(vk::HandleType)7>_> data_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  VkDevice physicalDevice_00;
  VkPhysicalDevice pVVar2;
  DeviceInterface *vki_00;
  deUint8 dVar3;
  Context *pCVar4;
  VkDeviceSize VVar5;
  Handle<(vk::HandleType)8> *pHVar6;
  Handle<(vk::HandleType)7> *pHVar7;
  void *pvVar8;
  ulong local_120;
  size_t ndx;
  deUint8 *data;
  Random rng;
  void *ptr;
  Move<vk::Handle<(vk::HandleType)7>_> local_e8;
  RefData<vk::Handle<(vk::HandleType)7>_> local_c8;
  Move<vk::Handle<(vk::HandleType)8>_> local_98;
  RefData<vk::Handle<(vk::HandleType)8>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilies;
  VkDevice device;
  VkPhysicalDevice physicalDevice;
  DeviceInterface *vkd;
  InstanceInterface *vki;
  PrepareContext *context_local;
  BufferCopyFromBuffer *this_local;
  
  vki = (InstanceInterface *)context;
  context_local = (PrepareContext *)this;
  pCVar4 = PrepareContext::getContext(context);
  vkd = (DeviceInterface *)Context::getInstanceInterface(pCVar4);
  pCVar4 = PrepareContext::getContext((PrepareContext *)vki);
  physicalDevice = (VkPhysicalDevice)Context::getDeviceInterface(pCVar4);
  pCVar4 = PrepareContext::getContext((PrepareContext *)vki);
  device = (VkDevice)Context::getPhysicalDevice(pCVar4);
  pCVar4 = PrepareContext::getContext((PrepareContext *)vki);
  queueFamilies = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)Context::getDevice(pCVar4);
  pCVar4 = PrepareContext::getContext((PrepareContext *)vki);
  Context::getQueueFamilies(&local_58,pCVar4);
  local_40 = &local_58;
  VVar5 = PrepareContext::getBufferSize((PrepareContext *)vki);
  this->m_bufferSize = VVar5;
  createBuffer(&local_98,(DeviceInterface *)physicalDevice,(VkDevice)queueFamilies,
               this->m_bufferSize,1,VK_SHARING_MODE_EXCLUSIVE,local_40);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data_00.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data_00.object.m_internal = local_78.object.m_internal;
  data_00.deleter.m_device = local_78.deleter.m_device;
  data_00.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_srcBuffer,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_98);
  vki_00 = vkd;
  pVVar2 = physicalDevice;
  physicalDevice_00 = device;
  pvVar1 = queueFamilies;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  bindBufferMemory(&local_e8,(InstanceInterface *)vki_00,(DeviceInterface *)pVVar2,
                   (VkPhysicalDevice)physicalDevice_00,(VkDevice)pvVar1,(VkBuffer)pHVar6->m_internal
                   ,2);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c8,(Move *)&local_e8);
  data_01.deleter.m_deviceIface = local_c8.deleter.m_deviceIface;
  data_01.object.m_internal = local_c8.object.m_internal;
  data_01.deleter.m_device = local_c8.deleter.m_device;
  data_01.deleter.m_allocator = local_c8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::operator=(&this->m_memory,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_e8);
  pVVar2 = physicalDevice;
  pvVar1 = queueFamilies;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                     (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  rng.m_rnd._8_8_ = pHVar7->m_internal;
  pvVar8 = mapMemory((DeviceInterface *)pVVar2,(VkDevice)pvVar1,(VkDeviceMemory)rng.m_rnd._8_8_,
                     this->m_bufferSize);
  de::Random::Random((Random *)&data,this->m_seed);
  for (local_120 = 0; pVVar2 = physicalDevice, pvVar1 = queueFamilies,
      local_120 < this->m_bufferSize; local_120 = local_120 + 1) {
    dVar3 = de::Random::getUint8((Random *)&data);
    *(deUint8 *)((long)pvVar8 + local_120) = dVar3;
  }
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                     (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)pVVar2,(VkDevice)pvVar1,(VkDeviceMemory)pHVar7->m_internal,0,
             this->m_bufferSize);
  pVVar2 = physicalDevice;
  pvVar1 = queueFamilies;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                     (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  (**(code **)(*(long *)pVVar2 + 0x40))(pVVar2,pvVar1,pHVar7->m_internal);
  de::Random::~Random((Random *)&data);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_58);
  return;
}

Assistant:

void BufferCopyFromBuffer::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_bufferSize	= context.getBufferSize();
	m_srcBuffer		= createBuffer(vkd, device, m_bufferSize, vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies);
	m_memory		= bindBufferMemory(vki, vkd, physicalDevice, device, *m_srcBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT);

	{
		void* const	ptr	= mapMemory(vkd, device, *m_memory, m_bufferSize);
		de::Random	rng	(m_seed);

		{
			deUint8* const	data = (deUint8*)ptr;

			for (size_t ndx = 0; ndx < (size_t)m_bufferSize; ndx++)
				data[ndx] = rng.getUint8();
		}

		vk::flushMappedMemoryRange(vkd, device, *m_memory, 0, m_bufferSize);
		vkd.unmapMemory(device, *m_memory);
	}
}